

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KCPServer.cpp
# Opt level: O0

void __thiscall net_uv::KCPServer::onSessionClose(KCPServer *this,Session *session)

{
  bool bVar1;
  pointer ppVar2;
  _Self local_30;
  uint32_t local_24;
  _Self local_20;
  iterator it;
  Session *session_local;
  KCPServer *this_local;
  
  if (session != (Session *)0x0) {
    it._M_node = (_Base_ptr)session;
    local_24 = Session::getSessionID(session);
    local_20._M_node =
         (_Base_ptr)
         std::
         map<unsigned_int,_net_uv::KCPServer::serverSessionData,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_net_uv::KCPServer::serverSessionData>_>_>
         ::find(&this->m_allSession,&local_24);
    local_30._M_node =
         (_Base_ptr)
         std::
         map<unsigned_int,_net_uv::KCPServer::serverSessionData,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_net_uv::KCPServer::serverSessionData>_>_>
         ::end(&this->m_allSession);
    bVar1 = std::operator!=(&local_20,&local_30);
    if (bVar1) {
      ppVar2 = std::
               _Rb_tree_iterator<std::pair<const_unsigned_int,_net_uv::KCPServer::serverSessionData>_>
               ::operator->(&local_20);
      (ppVar2->second).isInvalid = true;
      (*(this->super_Server).super_Runnable._vptr_Runnable[5])(this,6,it._M_node,0,0);
    }
  }
  return;
}

Assistant:

void KCPServer::onSessionClose(Session* session)
{
	if (session == NULL)
	{
		return;
	}
	auto it = m_allSession.find(session->getSessionID());
	if (it != m_allSession.end())
	{
		it->second.isInvalid = true;
		pushThreadMsg(NetThreadMsgType::DIS_CONNECT, session);
	}
}